

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_dense.c
# Opt level: O2

void denseMatvec(realtype **a,realtype *x,realtype *y,sunindextype m,sunindextype n)

{
  realtype *prVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar2 = 0;
  uVar4 = (ulong)(uint)m;
  if (m < 1) {
    uVar4 = uVar2;
  }
  for (; uVar4 != uVar2; uVar2 = uVar2 + 1) {
    y[uVar2] = 0.0;
  }
  uVar3 = 0;
  uVar2 = (ulong)(uint)n;
  if (n < 1) {
    uVar2 = uVar3;
  }
  for (; uVar3 != uVar2; uVar3 = uVar3 + 1) {
    prVar1 = a[uVar3];
    for (uVar5 = 0; uVar4 != uVar5; uVar5 = uVar5 + 1) {
      y[uVar5] = prVar1[uVar5] * x[uVar3] + y[uVar5];
    }
  }
  return;
}

Assistant:

void denseMatvec(realtype **a, realtype *x, realtype *y, sunindextype m, sunindextype n)
{
  SUNDlsMat_denseMatvec(a, x, y, m, n);
}